

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_entry.cpp
# Opt level: O0

astcenc_error astcenc_compress_reset(astcenc_context *ctxo)

{
  ParallelManager *in_RDI;
  astcenc_contexti *ctx;
  astcenc_error local_4;
  
  if (((in_RDI->m_lock).super___mutex_base._M_mutex.__data.__count & 0x10) == 0) {
    ParallelManager::reset(in_RDI);
    ParallelManager::reset(in_RDI);
    local_4 = ASTCENC_SUCCESS;
  }
  else {
    local_4 = ASTCENC_ERR_BAD_CONTEXT;
  }
  return local_4;
}

Assistant:

astcenc_error astcenc_compress_reset(
	astcenc_context* ctxo
) {
#if defined(ASTCENC_DECOMPRESS_ONLY)
	(void)ctxo;
	return ASTCENC_ERR_BAD_CONTEXT;
#else
	astcenc_contexti* ctx = &ctxo->context;
	if (ctx->config.flags & ASTCENC_FLG_DECOMPRESS_ONLY)
	{
		return ASTCENC_ERR_BAD_CONTEXT;
	}

	ctxo->manage_avg.reset();
	ctxo->manage_compress.reset();
	return ASTCENC_SUCCESS;
#endif
}